

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::AdvancedMatrixCS::Run(AdvancedMatrixCS *this)

{
  float fVar1;
  bool bVar2;
  GLuint GVar3;
  GLint GVar4;
  int local_1bc;
  float local_1b8;
  int i_2;
  GLfloat expected [32];
  GLfloat *out_data;
  int i_1;
  int i;
  GLfloat data [48];
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *glsl_cs;
  AdvancedMatrixCS *pAStack_18;
  bool status;
  AdvancedMatrixCS *this_local;
  
  glsl_cs._7_1_ = 1;
  local_28 = 
  "\nlayout(local_size_x = 1) in;\nlayout(std430) buffer Buffer {\n  mat4x3 dst4x3;\n  mat4 dst4;\n  mat4 src4;\n} b;\nuniform int g_index1;\nuniform int g_index2;\nvoid main() {\n  b.dst4x3[gl_LocalInvocationIndex] = b.src4[gl_LocalInvocationIndex].rgb;\n  b.dst4x3[gl_LocalInvocationIndex + 1u] = b.src4[gl_LocalInvocationIndex + 1u].aar;\n  b.dst4[g_index2][g_index1] = 17.0;\n  b.dst4[g_index2][g_index1] += 6.0;\n  b.dst4[3][0] = b.src4[3][0] != 44.0 ? 3.0 : 7.0;\n  b.dst4[3][1] = b.src4[3][1];\n}"
  ;
  pAStack_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "\nlayout(local_size_x = 1) in;\nlayout(std430) buffer Buffer {\n  mat4x3 dst4x3;\n  mat4 dst4;\n  mat4 src4;\n} b;\nuniform int g_index1;\nuniform int g_index2;\nvoid main() {\n  b.dst4x3[gl_LocalInvocationIndex] = b.src4[gl_LocalInvocationIndex].rgb;\n  b.dst4x3[gl_LocalInvocationIndex + 1u] = b.src4[gl_LocalInvocationIndex + 1u].aar;\n  b.dst4[g_index2][g_index1] = 17.0;\n  b.dst4[g_index2][g_index1] += 6.0;\n  b.dst4[3][0] = b.src4[3][0] != 44.0 ? 3.0 : 7.0;\n  b.dst4[3][1] = b.src4[3][1];\n}"
             ,&local_49);
  GVar3 = ShaderStorageBufferObjectBase::CreateProgramCS
                    (&this->super_ShaderStorageBufferObjectBase,&local_48);
  this->m_program = GVar3;
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_program);
  bVar2 = ShaderStorageBufferObjectBase::CheckProgram
                    (&this->super_ShaderStorageBufferObjectBase,this->m_program);
  if (bVar2) {
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_storage_buffer);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,this->m_storage_buffer);
    for (out_data._4_4_ = 0; out_data._4_4_ < 0x20; out_data._4_4_ = out_data._4_4_ + 1) {
      (&i_1)[out_data._4_4_] = 0;
    }
    for (out_data._0_4_ = 0x20; (int)out_data < 0x30; out_data._0_4_ = (int)out_data + 1) {
      (&i_1)[(int)out_data] = (int)(float)(int)out_data;
    }
    glu::CallLogWrapper::glBufferData
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0xc0,&i_1,0x88e8);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    GVar4 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                        super_GLWrapper.super_CallLogWrapper,this->m_program,"g_index1");
    glu::CallLogWrapper::glUniform1i
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,GVar4,1);
    GVar4 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                        super_GLWrapper.super_CallLogWrapper,this->m_program,"g_index2");
    glu::CallLogWrapper::glUniform1i
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,GVar4,2);
    glu::CallLogWrapper::glDispatchCompute
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x200);
    expected._120_8_ =
         glu::CallLogWrapper::glMapBufferRange
                   (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                     super_CallLogWrapper,0x90d2,0,0xc0,1);
    if ((void *)expected._120_8_ == (void *)0x0) {
      this_local = (AdvancedMatrixCS *)&DAT_ffffffffffffffff;
    }
    else {
      memcpy(&local_1b8,&DAT_02ac6620,0x80);
      for (local_1bc = 0; local_1bc < 0x20; local_1bc = local_1bc + 1) {
        fVar1 = *(float *)(expected._120_8_ + (long)local_1bc * 4);
        if ((fVar1 != (&local_1b8)[local_1bc]) || (NAN(fVar1) || NAN((&local_1b8)[local_1bc]))) {
          anon_unknown_0::Output
                    ("Received: %f, but expected: %f\n",
                     (double)*(float *)(expected._120_8_ + (long)local_1bc * 4),
                     (double)(&local_1b8)[local_1bc]);
          glsl_cs._7_1_ = 0;
        }
      }
      glu::CallLogWrapper::glUnmapBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2);
      if ((glsl_cs._7_1_ & 1) == 0) {
        this_local = (AdvancedMatrixCS *)&DAT_ffffffffffffffff;
      }
      else {
        this_local = (AdvancedMatrixCS *)0x0;
      }
    }
  }
  else {
    this_local = (AdvancedMatrixCS *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		bool			  status = true;
		const char* const glsl_cs =
			NL "layout(local_size_x = 1) in;" NL "layout(std430) buffer Buffer {" NL "  mat4x3 dst4x3;" NL
			   "  mat4 dst4;" NL "  mat4 src4;" NL "} b;" NL "uniform int g_index1;" NL "uniform int g_index2;" NL
			   "void main() {" NL "  b.dst4x3[gl_LocalInvocationIndex] = b.src4[gl_LocalInvocationIndex].rgb;" NL
			   "  b.dst4x3[gl_LocalInvocationIndex + 1u] = b.src4[gl_LocalInvocationIndex + 1u].aar;" NL
			   "  b.dst4[g_index2][g_index1] = 17.0;" NL "  b.dst4[g_index2][g_index1] += 6.0;" NL
			   "  b.dst4[3][0] = b.src4[3][0] != 44.0 ? 3.0 : 7.0;" NL "  b.dst4[3][1] = b.src4[3][1];" NL "}";
		m_program = CreateProgramCS(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		GLfloat data[16 + 16 + 16];
		for (int i  = 0; i < 32; ++i)
			data[i] = 0.0f;
		for (int i  = 32; i < 48; ++i)
			data[i] = (GLfloat)i;
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), &data[0], GL_DYNAMIC_DRAW);

		glUseProgram(m_program);
		glUniform1i(glGetUniformLocation(m_program, "g_index1"), 1);
		glUniform1i(glGetUniformLocation(m_program, "g_index2"), 2);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		GLfloat* out_data = (GLfloat*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), GL_MAP_READ_BIT);
		if (!out_data)
			return ERROR;
		GLfloat expected[32] = { 32.0f, 33.0f, 34.0f, 0.0f, 39.0f, 39.0f, 36.0f, 0.0f,
								 0.0f,  0.0f,  0.0f,  0.0f, 0.0f,  0.0f,  0.0f,  0.0f,

								 0.0f,  0.0f,  0.0f,  0.0f, 0.0f,  0.0f,  0.0f,  0.0f,
								 0.0f,  23.0f, 0.0f,  0.0f, 7.0f,  45.0f, 0.0f,  0.0f };
		for (int i = 0; i < 32; ++i)
		{
			if (out_data[i] != expected[i])
			{
				Output("Received: %f, but expected: %f\n", out_data[i], expected[i]);
				status = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		if (status)
			return NO_ERROR;
		else
			return ERROR;
	}